

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

float __thiscall sf::Font::getUnderlinePosition(Font *this,uint characterSize)

{
  bool bVar1;
  long lVar2;
  uint in_ESI;
  long in_RDI;
  FT_Face_conflict face;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  float fVar3;
  
  lVar2 = *(long *)(in_RDI + 8);
  if ((lVar2 == 0) ||
     (bVar1 = setCurrentSize((Font *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (uint)((ulong)in_RDI >> 0x20)), !bVar1)) {
    fVar3 = 0.0;
  }
  else if ((*(ulong *)(lVar2 + 0x10) & 1) == 0) {
    fVar3 = (float)in_ESI / 10.0;
  }
  else {
    lVar2 = FT_MulFix((long)*(short *)(lVar2 + 0x94),*(undefined8 *)(*(long *)(lVar2 + 0xa0) + 0x28)
                     );
    fVar3 = -(float)lVar2 / 64.0;
  }
  return fVar3;
}

Assistant:

float Font::getUnderlinePosition(unsigned int characterSize) const
{
    FT_Face face = static_cast<FT_Face>(m_face);

    if (face && setCurrentSize(characterSize))
    {
        // Return a fixed position if font is a bitmap font
        if (!FT_IS_SCALABLE(face))
            return static_cast<float>(characterSize) / 10.f;

        return -static_cast<float>(FT_MulFix(face->underline_position, face->size->metrics.y_scale)) / static_cast<float>(1 << 6);
    }
    else
    {
        return 0.f;
    }
}